

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# carLot2.cpp
# Opt level: O0

void __thiscall CarLot::GetMonthProfit(CarLot *this)

{
  Date DVar1;
  Date DVar2;
  bool bVar3;
  int iVar4;
  _Setprecision _Var5;
  size_type sVar6;
  ostream *poVar7;
  ulong uVar8;
  reference pvVar9;
  double dVar10;
  Date DVar11;
  Date local_e8;
  Date local_d8;
  Date local_c8;
  int local_bc;
  string local_b8 [4];
  int i;
  string local_98 [48];
  double local_68;
  double profit;
  int local_58;
  int carsSold;
  int profitMonth;
  int profitYear;
  string profitMonthString;
  string local_30 [8];
  string profitYearString;
  CarLot *this_local;
  
  sVar6 = std::vector<Car,_std::allocator<Car>_>::size(&this->cars);
  if (sVar6 == 0) {
    poVar7 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    poVar7 = std::operator<<(poVar7,"No cars in inventory!");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  }
  else {
    std::__cxx11::string::string(local_30);
    std::__cxx11::string::string((string *)&profitMonth);
    profit._4_4_ = 0;
    local_68 = 0.0;
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    std::istream::ignore((long)&std::cin,1000);
    while( true ) {
      while( true ) {
        std::operator<<((ostream *)&std::cout,
                        "Please enter the month for which you would like to calculate profit: ");
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&std::cin,(string *)&profitMonth);
        std::__cxx11::string::string(local_98,(string *)&profitMonth);
        bVar3 = ValidInt((string *)local_98,&local_58);
        std::__cxx11::string::~string(local_98);
        if (bVar3) break;
        poVar7 = std::operator<<((ostream *)&std::cout,"Invalid integer.");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      }
      if ((0 < local_58) && (local_58 < 0xd)) break;
      poVar7 = std::operator<<((ostream *)&std::cout,"Invalid month number.");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    while( true ) {
      while( true ) {
        std::operator<<((ostream *)&std::cout,
                        "Please enter the year for which you would like to calculate profit: ");
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&std::cin,local_30);
        std::__cxx11::string::string(local_b8,local_30);
        bVar3 = ValidInt((string *)local_b8,&carsSold);
        std::__cxx11::string::~string(local_b8);
        DVar2.year = local_c8.year;
        DVar2.day = local_c8.day;
        DVar2.month = local_c8.month;
        DVar1.year = local_d8.year;
        DVar1.day = local_d8.day;
        DVar1.month = local_d8.month;
        DVar11.year = local_e8.year;
        DVar11.day = local_e8.day;
        DVar11.month = local_e8.month;
        if (bVar3) break;
        poVar7 = std::operator<<((ostream *)&std::cout,"Invalid integer.");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      }
      if (0 < carsSold) break;
      poVar7 = std::operator<<((ostream *)&std::cout,"Invalid year number.");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    local_bc = 0;
    local_e8 = DVar11;
    local_d8 = DVar1;
    local_c8 = DVar2;
    while( true ) {
      uVar8 = (ulong)local_bc;
      sVar6 = std::vector<Car,_std::allocator<Car>_>::size(&this->cars);
      if (sVar6 <= uVar8) break;
      pvVar9 = std::vector<Car,_std::allocator<Car>_>::at(&this->cars,(long)local_bc);
      DVar11 = Car::GetDateSold(pvVar9);
      local_d8 = DVar11;
      local_c8 = DVar11;
      iVar4 = Date::GetYear(&local_c8);
      bVar3 = false;
      if (iVar4 == carsSold) {
        pvVar9 = std::vector<Car,_std::allocator<Car>_>::at(&this->cars,(long)local_bc);
        DVar11 = Car::GetDateSold(pvVar9);
        local_e8 = DVar11;
        iVar4 = Date::GetMonth(&local_e8);
        bVar3 = iVar4 == local_58;
      }
      if (bVar3) {
        profit._4_4_ = profit._4_4_ + 1;
        pvVar9 = std::vector<Car,_std::allocator<Car>_>::at(&this->cars,(long)local_bc);
        dVar10 = Car::GetProfit(pvVar9);
        local_68 = dVar10 + local_68;
      }
      local_bc = local_bc + 1;
    }
    if (profit._4_4_ < 1) {
      poVar7 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<(poVar7,"No cars sold in time period given.");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,profit._4_4_);
      poVar7 = std::operator<<(poVar7," car(s) sold for given time period.");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<((ostream *)&std::cout,"Total profit: $");
      _Var5 = std::setprecision(2);
      poVar7 = std::operator<<(poVar7,_Var5);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::fixed);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_68);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    std::__cxx11::string::~string((string *)&profitMonth);
    std::__cxx11::string::~string(local_30);
  }
  return;
}

Assistant:

void CarLot::GetMonthProfit()
{

    if(cars.size() == 0)
    {
        //Exit to main right away if there are no cars
        cout << endl << "No cars in inventory!" << endl << endl;
        return;
    }

    string profitYearString;
    string profitMonthString;
    int profitYear;
    int profitMonth;
    int carsSold = 0;
    double profit = 0;


    //Readability and clear the input buffer
    cout << endl;
    cin.ignore(1000, '\n');


    do
    {
        cout << "Please enter the month for which you would like to calculate profit: ";
        getline(cin, profitMonthString);

        if(ValidInt(profitMonthString, profitMonth))
        {
            if(profitMonth > 0 && profitMonth < 13)
            {
                break;
            }
            else
            {
                cout << "Invalid month number." << endl;
                continue;
            }
        }
        else
        {
            cout << "Invalid integer." << endl;
            continue;
        }
    }
    while(true);

    do
    {
        cout << "Please enter the year for which you would like to calculate profit: ";
        getline(cin, profitYearString);

        if(ValidInt(profitYearString, profitYear))
        {
            if(profitYear > 0)
            {
                break;
            }
            else
            {
                cout << "Invalid year number." << endl;
                continue;
            }
        }
        else
        {
            cout << "Invalid integer." << endl;
            continue;
        }
    }
    while(true);

    for(int i = 0; i < cars.size(); i++)
    {
        //We check to see if there are any cars for a given time period
        if(cars.at(i).GetDateSold().GetYear() == profitYear && cars.at(i).GetDateSold().GetMonth() == profitMonth)
        {
            //If there are, increment number of cars sold and profit number.
            //We will also use carsSold to verify that something was actually sold in the time period

            carsSold++;
            profit += cars.at(i).GetProfit();
        }
    }

    if(carsSold > 0)
    {
        cout << carsSold << " car(s) sold for given time period." << endl;
        cout << "Total profit: $" << setprecision(2) << fixed << profit << endl << endl;
    }
    else
    {
        cout << endl << "No cars sold in time period given." << endl << endl;
    }


}